

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall
OpticsParser::Parser::parseHeaderLine(Parser *this,string *line,ProductData *product)

{
  string *psVar1;
  allocator<char> local_21a;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  parseUnits(this,line,product);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Thickness",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"}",&local_21a);
  parsePropertyAtTheEnd<std::optional<double>>(this,&local_218,&local_1f8,line,&product->thickness);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Conductivity",&local_219)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"}",&local_21a);
  parsePropertyAtTheEnd<std::optional<double>>
            (this,&local_218,&local_1f8,line,&product->conductivity);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"IR Transmittance",&local_219);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"TIR=",&local_21a);
  parsePropertyAtTheEnd<std::optional<double>>
            (this,&local_218,&local_1f8,line,&product->IRTransmittance);
  std::__cxx11::string::~string((string *)&local_1f8);
  psVar1 = &local_218;
  std::__cxx11::string::~string((string *)psVar1);
  parseEmissivities((Parser *)psVar1,line,product);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Product Name",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_38,&product->productName);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&product->productType,"glazing");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Type",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_58,&product->productSubtype);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Ef_Source",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_78,&product->frontEmissivitySource);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Eb_Source",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_98,&product->backEmissivitySource);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Manufacturer",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::__cxx11::string>(this,line,&local_b8,&product->manufacturer);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Material",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_d8,&product->material);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Coating Name",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_f8,&product->coatingName);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Coated Side",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_118,&product->coatedSide);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Substrate Filename",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_138,&product->substrateFilename);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Appearance",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_158,&product->appearance);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Acceptance",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_178,&product->acceptance);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Extrapolation",(allocator<char> *)&local_218);
  parseStringPropertyInsideBraces<std::optional<std::__cxx11::string>>
            (this,line,&local_198,&product->extrapolation);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Specularity",(allocator<char> *)&local_218);
  parseBoolPropertyInsideBraces(this,line,&local_1b8,&product->specularity);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Permeability Factor",(allocator<char> *)&local_218);
  parseDoublePropertyInsideBraces(this,line,&local_1d8,&product->permeabilityFactor);
  psVar1 = &local_1d8;
  std::__cxx11::string::~string((string *)psVar1);
  parseNFRCID((Parser *)psVar1,line,product);
  parseAERCID((Parser *)psVar1,line,product);
  return;
}

Assistant:

void Parser::parseHeaderLine(const std::string & line, ProductData & product)
    {
        parseUnits(line, product);
        parsePropertyAtTheEnd("Thickness", "}", line, product.thickness);
        parsePropertyAtTheEnd("Conductivity", "}", line, product.conductivity);
        parsePropertyAtTheEnd("IR Transmittance", "TIR=", line, product.IRTransmittance);
        parseEmissivities(line, product);
        parseStringPropertyInsideBraces(line, "Product Name", product.productName);
        product.productType = "glazing";   // There are only glazing optics files.
        parseStringPropertyInsideBraces(line, "Type", product.productSubtype);
        parseStringPropertyInsideBraces(line, "Ef_Source", product.frontEmissivitySource);
        parseStringPropertyInsideBraces(line, "Eb_Source", product.backEmissivitySource);
        parseStringPropertyInsideBraces(line, "Manufacturer", product.manufacturer);
        parseStringPropertyInsideBraces(line, "Material", product.material);
        parseStringPropertyInsideBraces(line, "Coating Name", product.coatingName);
        parseStringPropertyInsideBraces(line, "Coated Side", product.coatedSide);
        parseStringPropertyInsideBraces(line, "Substrate Filename", product.substrateFilename);
        parseStringPropertyInsideBraces(line, "Appearance", product.appearance);
        parseStringPropertyInsideBraces(line, "Acceptance", product.acceptance);
        parseStringPropertyInsideBraces(line, "Extrapolation", product.extrapolation);
        parseBoolPropertyInsideBraces(line, "Specularity", product.specularity);
        parseDoublePropertyInsideBraces(line, "Permeability Factor", product.permeabilityFactor);
        parseNFRCID(line, product);
        parseAERCID(line, product);
    }